

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::SetupWriteRccInfo(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *this_00;
  char *__s;
  allocator<char> local_2f9;
  undefined1 local_2f8 [8];
  string err;
  allocator<char> local_2b1;
  string local_2b0;
  undefined1 local_280 [8];
  InfoWriter ofs;
  Qrc *qrc;
  iterator __end1;
  iterator __begin1;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range1;
  cmQtAutoGenInitializer *this_local;
  
  this_00 = &(this->Rcc).Qrcs;
  __end1 = std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
           begin(this_00);
  qrc = (Qrc *)std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                                     *)&qrc), bVar1) {
    ofs.Ofs_._576_8_ =
         __gnu_cxx::
         __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
         ::operator*(&__end1);
    InfoWriter::InfoWriter((InfoWriter *)local_280,&((reference)ofs.Ofs_._576_8_)->InfoFile);
    bVar1 = InfoWriter::operator_cast_to_bool((InfoWriter *)local_280);
    if (bVar1) {
      InfoWriter::Write((InfoWriter *)local_280,"# Configurations\n");
      __s = "FALSE";
      if ((this->MultiConfig & 1U) != 0) {
        __s = "TRUE";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,__s,&local_2b1);
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_MULTI_CONFIG",&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_VERBOSITY",&this->Verbosity);
      InfoWriter::Write((InfoWriter *)local_280,"# Settings file\n");
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_SETTINGS_FILE",
                        (string *)(ofs.Ofs_._576_8_ + 0xa0));
      InfoWriter::WriteConfig
                ((InfoWriter *)local_280,"ARCC_SETTINGS_FILE",
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(ofs.Ofs_._576_8_ + 0xc0));
      InfoWriter::Write((InfoWriter *)local_280,"# Directories\n");
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_BUILD_DIR",&(this->Dir).Build);
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_INCLUDE_DIR",&(this->Dir).Include);
      InfoWriter::WriteConfig((InfoWriter *)local_280,"ARCC_INCLUDE_DIR",&(this->Dir).ConfigInclude)
      ;
      InfoWriter::Write((InfoWriter *)local_280,"# Rcc executable\n");
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_RCC_EXECUTABLE",
                        &(this->Rcc).super_GenVarsT.Executable);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_280,"ARCC_RCC_LIST_OPTIONS",&(this->Rcc).ListOptions);
      InfoWriter::Write((InfoWriter *)local_280,"# Rcc job\n");
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_LOCK_FILE",(string *)ofs.Ofs_._576_8_);
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_SOURCE",(string *)(ofs.Ofs_._576_8_ + 0x20));
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_OUTPUT_CHECKSUM",
                        (string *)(ofs.Ofs_._576_8_ + 0x60));
      cmsys::SystemTools::GetFilenameName
                ((string *)((long)&err.field_2 + 8),(string *)(ofs.Ofs_._576_8_ + 0xf0));
      InfoWriter::Write((InfoWriter *)local_280,"ARCC_OUTPUT_NAME",
                        (string *)((long)&err.field_2 + 8));
      std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_280,"ARCC_OPTIONS",
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(ofs.Ofs_._576_8_ + 0x118));
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_280,"ARCC_INPUTS",
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(ofs.Ofs_._576_8_ + 0x130));
      bVar1 = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2f8,"AutoRcc: Could not write file ",&local_2f9);
      std::allocator<char>::~allocator(&local_2f9);
      std::__cxx11::string::operator+=((string *)local_2f8,(string *)(ofs.Ofs_._576_8_ + 0x80));
      cmSystemTools::Error((string *)local_2f8);
      this_local._7_1_ = 0;
      bVar1 = true;
      std::__cxx11::string::~string((string *)local_2f8);
    }
    InfoWriter::~InfoWriter((InfoWriter *)local_280);
    if (bVar1) goto LAB_0027a23d;
    __gnu_cxx::
    __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 1;
LAB_0027a23d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteRccInfo()
{
  for (Qrc const& qrc : this->Rcc.Qrcs) {
    InfoWriter ofs(qrc.InfoFile);
    if (ofs) {
      // Write
      ofs.Write("# Configurations\n");
      ofs.Write("ARCC_MULTI_CONFIG", this->MultiConfig ? "TRUE" : "FALSE");
      ofs.Write("ARCC_VERBOSITY", this->Verbosity);
      ofs.Write("# Settings file\n");
      ofs.Write("ARCC_SETTINGS_FILE", qrc.SettingsFile);
      ofs.WriteConfig("ARCC_SETTINGS_FILE", qrc.ConfigSettingsFile);

      ofs.Write("# Directories\n");
      ofs.Write("ARCC_BUILD_DIR", this->Dir.Build);
      ofs.Write("ARCC_INCLUDE_DIR", this->Dir.Include);
      ofs.WriteConfig("ARCC_INCLUDE_DIR", this->Dir.ConfigInclude);

      ofs.Write("# Rcc executable\n");
      ofs.Write("ARCC_RCC_EXECUTABLE", this->Rcc.Executable);
      ofs.WriteStrings("ARCC_RCC_LIST_OPTIONS", this->Rcc.ListOptions);

      ofs.Write("# Rcc job\n");
      ofs.Write("ARCC_LOCK_FILE", qrc.LockFile);
      ofs.Write("ARCC_SOURCE", qrc.QrcFile);
      ofs.Write("ARCC_OUTPUT_CHECKSUM", qrc.PathChecksum);
      ofs.Write("ARCC_OUTPUT_NAME",
                cmSystemTools::GetFilenameName(qrc.RccFile));
      ofs.WriteStrings("ARCC_OPTIONS", qrc.Options);
      ofs.WriteStrings("ARCC_INPUTS", qrc.Resources);
    } else {
      std::string err = "AutoRcc: Could not write file ";
      err += qrc.InfoFile;
      cmSystemTools::Error(err);
      return false;
    }
  }

  return true;
}